

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::operator()
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *this,
          vector<rc,_std::allocator<rc>_> *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  pointer prVar2;
  int iVar3;
  size_type sVar4;
  int8_t *piVar5;
  ulong uVar6;
  value_type *pvVar7;
  long lVar8;
  long lVar9;
  solver_failure *this_00;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  __i;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  
  if (bk_min < r_size) {
    details::fail_fast("Assertion","bk_min <= bk_max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"454");
  }
  *(int *)(this + 100) = r_size;
  *(int *)(this + 0x68) = bk_min;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
            *)(this + 0x20),4);
  iVar3 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)0x4);
  if ((char)iVar3 == '\0') {
    this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
    solver_failure::solver_failure(this_00,no_solver_available);
    __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = shared_subvector::emplace((shared_subvector *)this);
  *(size_type *)(this + 0x60) = sVar4;
  if (sVar4 != 0) {
    details::fail_fast("Assertion","solution == 0u",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"465");
  }
  if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
    *(long *)(this + 0x40) = *(long *)(this + 0x38);
  }
  prVar2 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = *(long *)(this + 0x20);
  for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
    *(undefined8 *)(lVar14 + lVar11 * 2) = *(undefined8 *)((long)&prVar2->value + lVar11);
    *(undefined4 *)(lVar14 + 0x18 + lVar11 * 2) = *(undefined4 *)((long)&prVar2->id + lVar11);
    iVar3 = *(int *)((long)&prVar2->f + lVar11);
    *(int *)(lVar14 + 0x14 + lVar11 * 2) = iVar3;
    iVar12 = -iVar3;
    if (0 < iVar3) {
      iVar12 = iVar3;
    }
    *(int *)(lVar14 + 0x10 + lVar11 * 2) = iVar12;
    *(undefined4 *)(lVar14 + 0x1c + lVar11 * 2) = 0;
  }
  piVar5 = shared_subvector::element_data((shared_subvector *)this,0);
  std::__fill_n_a<signed_char*,unsigned_int,int>(piVar5,*(undefined4 *)(this + 0x18));
  std::
  __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
  lVar14 = *(long *)(this + 0x20);
  lVar11 = *(long *)(this + 0x28);
  iVar3 = *(int *)(this + 100);
  iVar12 = *(int *)(this + 0x68);
  piVar17 = (int *)(lVar14 + 0x14);
  lVar15 = lVar11 - lVar14 >> 5;
  while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
    if (*piVar17 < 0) {
      iVar3 = iVar3 + piVar17[-1];
      iVar12 = iVar12 + piVar17[-1];
      *(int *)(this + 100) = iVar3;
      *(int *)(this + 0x68) = iVar12;
    }
    piVar17 = piVar17 + 8;
  }
  *(undefined8 *)(lVar11 + -0x18) = *(undefined8 *)(lVar11 + -0x20);
  for (uVar10 = (int)((ulong)(lVar11 - lVar14) >> 5) - 2; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
    lVar11 = (ulong)uVar10 * 0x20;
    *(double *)(lVar14 + 8 + lVar11) =
         *(double *)(lVar14 + 0x28 + lVar11) + *(double *)(lVar14 + lVar11);
  }
  if (iVar12 == iVar3) {
    branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_equality
              ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
  }
  else {
    branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
              ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
  }
  lVar14 = *(long *)(this + 0x20);
  iVar3 = 0;
  uVar6 = *(long *)(this + 0x28) - lVar14;
  for (uVar18 = 0; (uVar6 & 0x1fffffffe0) != uVar18; uVar18 = uVar18 + 0x20) {
    iVar12 = *(int *)(lVar14 + 0x14 + uVar18);
    pvVar7 = shared_subvector::operator[]((shared_subvector *)this,*(int *)(this + 0x60) + iVar3);
    lVar14 = *(long *)(this + 0x20);
    iVar3 = iVar3 + 1;
    *(uint *)(lVar14 + 0x1c + uVar18) = (uint)((*pvVar7 == '\0') != 0 < iVar12);
  }
  lVar14 = *(long *)(this + 0x20);
  lVar11 = *(long *)(this + 0x28);
  if (lVar14 != lVar11) {
    std::operator()(lVar14,lVar11,(int)LZCOUNT(lVar11 - lVar14 >> 5) * 2 ^ 0x7e);
    if (lVar11 - lVar14 < 0x201) {
      std::operator()(lVar14,lVar11);
    }
    else {
      lVar15 = lVar14 + 0x200;
      std::operator()(lVar14,lVar15);
      for (; lVar15 != lVar11; lVar15 = lVar15 + 0x20) {
        std::operator()(lVar15);
      }
    }
  }
  lVar11 = *(long *)(this + 0x20);
  lVar15 = *(long *)(this + 0x28);
  lVar13 = lVar15 - lVar11;
  lVar14 = lVar11 + 0x40;
  lVar16 = lVar13;
  for (lVar8 = lVar13 >> 7; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (*(int *)(lVar14 + -0x24) == 0) {
      lVar9 = lVar14 + -0x40;
      goto LAB_00105c78;
    }
    if (*(int *)(lVar14 + -4) == 0) {
      lVar9 = lVar14 + -0x20;
      goto LAB_00105c78;
    }
    lVar9 = lVar14;
    if (*(int *)(lVar14 + 0x1c) == 0) goto LAB_00105c78;
    if (*(int *)(lVar14 + 0x3c) == 0) {
      lVar9 = lVar14 + 0x20;
      goto LAB_00105c78;
    }
    lVar14 = lVar14 + 0x80;
    lVar16 = lVar16 + -0x80;
  }
  lVar16 = lVar16 >> 5;
  lVar8 = lVar14 + -0x40;
  if (lVar16 != 1) {
    if (lVar16 == 3) {
      lVar9 = lVar8;
      if (*(int *)(lVar14 + -0x24) == 0) goto LAB_00105c78;
      lVar8 = lVar14 + -0x20;
    }
    else {
      lVar9 = lVar15;
      if (lVar16 != 2) goto LAB_00105c78;
    }
    lVar9 = lVar8;
    if (*(int *)(lVar8 + 0x1c) == 0) goto LAB_00105c78;
    lVar8 = lVar8 + 0x20;
  }
  lVar9 = lVar8;
  if (*(int *)(lVar8 + 0x1c) != 0) {
    lVar9 = lVar15;
  }
LAB_00105c78:
  prVar2 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = lVar13 >> 5;
  lVar14 = 0;
  while (bVar19 = lVar13 != 0, lVar13 = lVar13 + -1, bVar19) {
    *(undefined8 *)((long)&prVar2->value + lVar14) = *(undefined8 *)(lVar11 + lVar14 * 2);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(lVar11 + 0x14 + lVar14 * 2);
    auVar20 = vshufps_avx(auVar20,auVar20,0xe1);
    uVar1 = vmovlpd_avx(auVar20);
    *(undefined8 *)((long)&prVar2->id + lVar14) = uVar1;
    lVar14 = lVar14 + 0x10;
  }
  if (lVar9 == lVar15) {
    uVar10 = -(uint)(*(int *)(lVar11 + 0x1c) == 0) | 4;
  }
  else {
    uVar10 = (int)((ulong)(lVar9 - lVar11) >> 5) - 1;
  }
  return uVar10;
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }